

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O2

void __thiscall fasttext::QMatrix::quantizeNorm(QMatrix *this,Vector *norms)

{
  real *x;
  uint __line;
  long lVar1;
  char *__assertion;
  
  if (this->qnorm_ == false) {
    __assertion = "qnorm_";
    __line = 0x21;
  }
  else {
    x = (norms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar1 = (long)(norms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)x >> 2;
    if (lVar1 == this->m_) {
      ProductQuantizer::train
                ((this->npq_)._M_t.
                 super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                 .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
                 (int32_t)lVar1,x);
      ProductQuantizer::compute_codes
                ((this->npq_)._M_t.
                 super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                 .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,x,
                 (this->norm_codes_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,(int32_t)this->m_);
      return;
    }
    __assertion = "norms.size() == m_";
    __line = 0x22;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                ,__line,"void fasttext::QMatrix::quantizeNorm(const Vector &)");
}

Assistant:

void QMatrix::quantizeNorm(const Vector& norms) {
  assert(qnorm_);
  assert(norms.size() == m_);
  auto dataptr = norms.data();
  npq_->train(m_, dataptr);
  npq_->compute_codes(dataptr, norm_codes_.data(), m_);
}